

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[8],pstack::ReaderArray<Elf64_Sym,42ul>,pstack::Elf::Section>
          (JObject *this,char (*k) [8],ReaderArray<Elf64_Sym,_42UL> *v,Section *c)

{
  ostream *os;
  JSON<pstack::Field<char[8],_pstack::ReaderArray<Elf64_Sym,_42UL>_>,_pstack::Elf::Section> local_48
  ;
  undefined1 local_38 [8];
  Field<char[8],_pstack::ReaderArray<Elf64_Sym,_42UL>_> field;
  Section *c_local;
  ReaderArray<Elf64_Sym,_42UL> *v_local;
  char (*k_local) [8];
  JObject *this_local;
  
  field.v = (ReaderArray<Elf64_Sym,_42UL> *)c;
  Field<char[8],_pstack::ReaderArray<Elf64_Sym,_42UL>_>::Field
            ((Field<char[8],_pstack::ReaderArray<Elf64_Sym,_42UL>_> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[8],pstack::ReaderArray<Elf64_Sym,42ul>>,pstack::Elf::Section>
                       ((Field<char[8],_pstack::ReaderArray<Elf64_Sym,_42UL>_> *)local_38,
                        (Section *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }